

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiViewportP::ImGuiViewportP(ImGuiViewportP *this)

{
  ImGuiViewportP *this_local;
  
  ImGuiViewport::ImGuiViewport(&this->super_ImGuiViewport);
  ImDrawData::ImDrawData(&this->DrawDataP);
  ImDrawDataBuilder::ImDrawDataBuilder(&this->DrawDataBuilder);
  ImVec2::ImVec2(&this->WorkOffsetMin);
  ImVec2::ImVec2(&this->WorkOffsetMax);
  ImVec2::ImVec2(&this->BuildWorkOffsetMin);
  ImVec2::ImVec2(&this->BuildWorkOffsetMax);
  this->DrawListsLastFrame[1] = -1;
  this->DrawListsLastFrame[0] = -1;
  this->DrawLists[1] = (ImDrawList *)0x0;
  this->DrawLists[0] = (ImDrawList *)0x0;
  return;
}

Assistant:

ImGuiViewportP()    { DrawListsLastFrame[0] = DrawListsLastFrame[1] = -1; DrawLists[0] = DrawLists[1] = NULL; }